

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O1

int sexp_peek_char(sexp ctx,sexp in)

{
  sexp psVar1;
  sexp psVar2;
  sexp_uint_t sVar3;
  uint __c;
  
  psVar1 = (in->value).type.setters;
  if (psVar1 == (sexp)0x0) {
    __c = getc((FILE *)(in->value).type.getters);
  }
  else {
    psVar2 = (in->value).type.print;
    if (psVar2 < (sexp)(in->value).port.size) {
      (in->value).type.print = (sexp)((long)&psVar2->tag + 1);
      __c = (uint)*(byte *)((long)&psVar2->tag + (long)&psVar1->tag);
    }
    else {
      __c = sexp_buffered_read_char(ctx,in);
    }
  }
  if (__c != 0xffffffff) {
    sVar3 = (in->value).bytecode.max_depth;
    if (sVar3 == 0) {
      ungetc(__c,(FILE *)(in->value).type.getters);
    }
    else {
      psVar1 = (in->value).type.print;
      (in->value).type.print = (sexp)((long)&psVar1[-1].value + 0x60bf);
      *(char *)((sVar3 - 1) + (long)psVar1) = (char)__c;
    }
  }
  return __c;
}

Assistant:

static int sexp_peek_char(sexp ctx, sexp in) {
  int c = sexp_read_char(ctx, in);
  if (c != EOF) sexp_push_char(ctx, c, in);
  return c;
}